

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void trimFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  undefined8 *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  uint len_1;
  uint len;
  uchar *z;
  int nChar;
  uchar **azChar;
  uint *aLen;
  int i;
  int flags;
  uint nIn;
  uchar *zCharSet;
  uchar *zIn;
  _func_void_void_ptr *in_stack_ffffffffffffff98;
  uint local_60;
  uint in_stack_ffffffffffffffa4;
  byte *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uchar **local_48;
  uchar **local_40;
  int local_34;
  uint local_2c;
  byte *local_28;
  uchar *local_20;
  
  local_40 = (uchar **)0x0;
  local_48 = (uchar **)0x0;
  iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if ((iVar1 != 5) &&
     (local_20 = sqlite3_value_text((sqlite3_value *)0x222eaa), local_20 != (uchar *)0x0)) {
    local_2c = sqlite3_value_bytes((sqlite3_value *)0x222ec9);
    if (in_ESI == 1) {
      iVar1 = 1;
      local_40 = (uchar **)trimFunc::lenOne;
      local_48 = trimFunc::azOne;
      local_28 = (byte *)0x0;
    }
    else {
      local_28 = sqlite3_value_text((sqlite3_value *)0x222f10);
      if (local_28 == (byte *)0x0) {
        return;
      }
      iVar1 = 0;
      in_stack_ffffffffffffffa8 = local_28;
      while (*in_stack_ffffffffffffffa8 != 0) {
        pbVar4 = in_stack_ffffffffffffffa8 + 1;
        if (0xbf < *in_stack_ffffffffffffffa8) {
          for (; (*pbVar4 & 0xc0) == 0x80; pbVar4 = pbVar4 + 1) {
          }
        }
        iVar1 = iVar1 + 1;
        in_stack_ffffffffffffffa8 = pbVar4;
      }
      if (0 < iVar1) {
        local_48 = (uchar **)
                   contextMalloc((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                                 (i64)in_stack_ffffffffffffffa8);
        if (local_48 == (uchar **)0x0) {
          return;
        }
        local_40 = local_48 + iVar1;
        iVar1 = 0;
        in_stack_ffffffffffffffa8 = local_28;
        while (*in_stack_ffffffffffffffa8 != 0) {
          local_48[iVar1] = in_stack_ffffffffffffffa8;
          pbVar4 = in_stack_ffffffffffffffa8 + 1;
          if (0xbf < *in_stack_ffffffffffffffa8) {
            for (; (*pbVar4 & 0xc0) == 0x80; pbVar4 = pbVar4 + 1) {
            }
          }
          *(int *)((long)local_40 + (long)iVar1 * 4) = (int)pbVar4 - (int)local_48[iVar1];
          iVar1 = iVar1 + 1;
          in_stack_ffffffffffffffa8 = pbVar4;
        }
      }
    }
    if (0 < iVar1) {
      pvVar3 = sqlite3_user_data(in_RDI);
      if (((ulong)pvVar3 & 1) != 0) {
        for (; local_2c != 0; local_2c = local_2c - in_stack_ffffffffffffffa4) {
          in_stack_ffffffffffffffa4 = 0;
          local_34 = 0;
          while ((local_34 < iVar1 &&
                 ((in_stack_ffffffffffffffa4 = *(uint *)((long)local_40 + (long)local_34 * 4),
                  local_2c < in_stack_ffffffffffffffa4 ||
                  (iVar2 = memcmp(local_20,local_48[local_34],(ulong)in_stack_ffffffffffffffa4),
                  iVar2 != 0))))) {
            local_34 = local_34 + 1;
          }
          if (iVar1 <= local_34) break;
          local_20 = local_20 + in_stack_ffffffffffffffa4;
        }
      }
      if (((ulong)pvVar3 & 2) != 0) {
        for (; local_2c != 0; local_2c = local_2c - local_60) {
          local_60 = 0;
          local_34 = 0;
          while ((local_34 < iVar1 &&
                 ((local_60 = *(uint *)((long)local_40 + (long)local_34 * 4), local_2c < local_60 ||
                  (iVar2 = memcmp(local_20 + (local_2c - local_60),local_48[local_34],
                                  (ulong)local_60), iVar2 != 0))))) {
            local_34 = local_34 + 1;
          }
          if (iVar1 <= local_34) break;
        }
      }
      if (local_28 != (byte *)0x0) {
        sqlite3_free((void *)0x22322d);
      }
    }
    sqlite3_result_text((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                        (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

static void trimFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zIn;         /* Input string */
  const unsigned char *zCharSet;    /* Set of characters to trim */
  unsigned int nIn;                 /* Number of bytes in input */
  int flags;                        /* 1: trimleft  2: trimright  3: trim */
  int i;                            /* Loop counter */
  unsigned int *aLen = 0;           /* Length of each character in zCharSet */
  unsigned char **azChar = 0;       /* Individual characters in zCharSet */
  int nChar;                        /* Number of characters in zCharSet */

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    return;
  }
  zIn = sqlite3_value_text(argv[0]);
  if( zIn==0 ) return;
  nIn = (unsigned)sqlite3_value_bytes(argv[0]);
  assert( zIn==sqlite3_value_text(argv[0]) );
  if( argc==1 ){
    static const unsigned lenOne[] = { 1 };
    static unsigned char * const azOne[] = { (u8*)" " };
    nChar = 1;
    aLen = (unsigned*)lenOne;
    azChar = (unsigned char **)azOne;
    zCharSet = 0;
  }else if( (zCharSet = sqlite3_value_text(argv[1]))==0 ){
    return;
  }else{
    const unsigned char *z;
    for(z=zCharSet, nChar=0; *z; nChar++){
      SQLITE_SKIP_UTF8(z);
    }
    if( nChar>0 ){
      azChar = contextMalloc(context,
                     ((i64)nChar)*(sizeof(char*)+sizeof(unsigned)));
      if( azChar==0 ){
        return;
      }
      aLen = (unsigned*)&azChar[nChar];
      for(z=zCharSet, nChar=0; *z; nChar++){
        azChar[nChar] = (unsigned char *)z;
        SQLITE_SKIP_UTF8(z);
        aLen[nChar] = (unsigned)(z - azChar[nChar]);
      }
    }
  }
  if( nChar>0 ){
    flags = SQLITE_PTR_TO_INT(sqlite3_user_data(context));
    if( flags & 1 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(zIn, azChar[i], len)==0 ) break;
        }
        if( i>=nChar ) break;
        zIn += len;
        nIn -= len;
      }
    }
    if( flags & 2 ){
      while( nIn>0 ){
        unsigned int len = 0;
        for(i=0; i<nChar; i++){
          len = aLen[i];
          if( len<=nIn && memcmp(&zIn[nIn-len],azChar[i],len)==0 ) break;
        }
        if( i>=nChar ) break;
        nIn -= len;
      }
    }
    if( zCharSet ){
      sqlite3_free(azChar);
    }
  }
  sqlite3_result_text(context, (char*)zIn, nIn, SQLITE_TRANSIENT);
}